

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O0

uint32_t __thiscall AddressUseTracker::Check(AddressUseTracker *this,uint8_t *addr,size_t len)

{
  uint32_t uVar1;
  IPAsKeyLRU *pIVar2;
  IPAsKeyLRU *y;
  IPAsKeyLRU *pIStack_40;
  bool stored;
  IPAsKeyLRU *removed;
  uint32_t count;
  IPAsKeyLRU *local_28;
  IPAsKeyLRU *x;
  size_t len_local;
  uint8_t *addr_local;
  AddressUseTracker *this_local;
  
  x = (IPAsKeyLRU *)len;
  len_local = (size_t)addr;
  addr_local = (uint8_t *)this;
  pIVar2 = (IPAsKeyLRU *)operator_new(0x48);
  IPAsKeyLRU::IPAsKeyLRU(pIVar2,(uint8_t *)len_local,(size_t)x);
  removed._0_4_ = 1;
  local_28 = pIVar2;
  while (uVar1 = LruHash<IPAsKeyLRU>::GetCount(&this->table), this->table_lru_max <= uVar1) {
    pIStack_40 = LruHash<IPAsKeyLRU>::RemoveLRU(&this->table);
    if ((pIStack_40 != (IPAsKeyLRU *)0x0) && (pIStack_40 != (IPAsKeyLRU *)0x0)) {
      (*(pIStack_40->super_IPAsKey)._vptr_IPAsKey[1])();
    }
  }
  if (local_28 != (IPAsKeyLRU *)0x0) {
    y._7_1_ = 0;
    pIVar2 = LruHash<IPAsKeyLRU>::InsertOrAdd(&this->table,local_28,false,(bool *)((long)&y + 7));
    if (((y._7_1_ & 1) == 0) && (local_28 != (IPAsKeyLRU *)0x0)) {
      (*(local_28->super_IPAsKey)._vptr_IPAsKey[1])();
    }
    if (pIVar2 != (IPAsKeyLRU *)0x0) {
      removed._0_4_ = (pIVar2->super_IPAsKey).count;
    }
  }
  return (uint32_t)removed;
}

Assistant:

uint32_t AddressUseTracker::Check(uint8_t * addr, size_t len)
{
    IPAsKeyLRU * x = new IPAsKeyLRU(addr, len);
    uint32_t count = 1;

    while (table.GetCount() >= table_lru_max)
    {
        IPAsKeyLRU * removed = table.RemoveLRU();

        if (removed != NULL)
        {
            delete removed;
        }
    }

    if (x != NULL)
    {
        bool stored = false;

        IPAsKeyLRU * y = table.InsertOrAdd(x, false, &stored);

        if (!stored)
        {
            delete x;
        }

        if (y != NULL)
        {
            count = y->count;
        }
    }

    return count;
}